

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,AV1_COMMON *cm,int rows)

{
  pthread_mutex_t *ppVar1;
  pthread_cond_t *ppVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)rows;
  ppVar1 = (pthread_mutex_t *)aom_malloc(lVar4 * 0x28);
  row_mt_sync->mutex_ = ppVar1;
  if (ppVar1 == (pthread_mutex_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate row_mt_sync->mutex_");
  }
  if (0 < rows && row_mt_sync->mutex_ != (pthread_mutex_t *)0x0) {
    lVar5 = 0;
    do {
      pthread_mutex_init((pthread_mutex_t *)((long)row_mt_sync->mutex_ + lVar5),
                         (pthread_mutexattr_t *)0x0);
      lVar5 = lVar5 + 0x28;
    } while ((ulong)(uint)rows * 0x28 != lVar5);
  }
  ppVar2 = (pthread_cond_t *)aom_malloc(lVar4 * 0x30);
  row_mt_sync->cond_ = ppVar2;
  if (ppVar2 == (pthread_cond_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate row_mt_sync->cond_");
  }
  if (0 < rows && row_mt_sync->cond_ != (pthread_cond_t *)0x0) {
    lVar5 = 0;
    do {
      pthread_cond_init((pthread_cond_t *)((long)row_mt_sync->cond_ + lVar5),
                        (pthread_condattr_t *)0x0);
      lVar5 = lVar5 + 0x30;
    } while ((ulong)(uint)rows * 0x30 != lVar5);
  }
  piVar3 = (int *)aom_malloc(lVar4 << 2);
  row_mt_sync->num_finished_cols = piVar3;
  if (piVar3 == (int *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate row_mt_sync->num_finished_cols");
  }
  row_mt_sync->rows = rows;
  row_mt_sync->sync_range = 1;
  return;
}

Assistant:

static void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,
                                  AV1_COMMON *cm, int rows) {
#if CONFIG_MULTITHREAD
  int i;

  CHECK_MEM_ERROR(cm, row_mt_sync->mutex_,
                  aom_malloc(sizeof(*row_mt_sync->mutex_) * rows));
  if (row_mt_sync->mutex_) {
    for (i = 0; i < rows; ++i) {
      pthread_mutex_init(&row_mt_sync->mutex_[i], NULL);
    }
  }

  CHECK_MEM_ERROR(cm, row_mt_sync->cond_,
                  aom_malloc(sizeof(*row_mt_sync->cond_) * rows));
  if (row_mt_sync->cond_) {
    for (i = 0; i < rows; ++i) {
      pthread_cond_init(&row_mt_sync->cond_[i], NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD

  CHECK_MEM_ERROR(cm, row_mt_sync->num_finished_cols,
                  aom_malloc(sizeof(*row_mt_sync->num_finished_cols) * rows));

  row_mt_sync->rows = rows;
  // Set up nsync.
  row_mt_sync->sync_range = 1;
}